

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void Am_Stop_Animator(Am_Object *interp)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_28;
  undefined1 local_20 [8];
  Am_Object_Method method;
  Am_Object *interp_local;
  
  method.Call = (Am_Object_Method_Type *)interp;
  pAVar2 = Am_Object::Get(interp,0xf7,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  if (bVar1) {
    Am_Object::Set(interp,0xf7,false,0);
    pAVar2 = Am_Object::Get(interp,0xca,0);
    Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_20,pAVar2);
    bVar1 = Am_Object_Method::Valid((Am_Object_Method *)local_20);
    if (bVar1) {
      Am_Object::Am_Object(&local_28,interp);
      (*(code *)method.from_wrapper)(&local_28);
      Am_Object::~Am_Object(&local_28);
    }
  }
  return;
}

Assistant:

void
Am_Stop_Animator(Am_Object interp)
{
  if (!static_cast<bool>(interp.Get(Am_RUNNING))) {
    return;
  }

  interp.Set(Am_RUNNING, false);

  Am_Object_Method method = interp.Get(Am_DO_METHOD);
  if (method.Valid()) {
    method.Call(interp);
  }

  return;
}